

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::resetDiceValuesMap(Dice *this)

{
  undefined4 in_EAX;
  mapped_type *pmVar1;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *this_00;
  undefined8 uStack_18;
  
  this_00 = &this->DiceValues;
  uStack_18 = CONCAT44(3,in_EAX);
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&uStack_18 + 4));
  *pmVar1 = 0;
  uStack_18 = CONCAT44(1,(undefined4)uStack_18);
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&uStack_18 + 4));
  *pmVar1 = 0;
  uStack_18 = CONCAT44(4,(undefined4)uStack_18);
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&uStack_18 + 4));
  *pmVar1 = 0;
  uStack_18 = CONCAT44(2,(undefined4)uStack_18);
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&uStack_18 + 4));
  *pmVar1 = 0;
  uStack_18 = uStack_18 & 0xffffffff;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&uStack_18 + 4));
  *pmVar1 = 0;
  uStack_18 = CONCAT44(5,(undefined4)uStack_18);
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,(key_type *)((long)&uStack_18 + 4));
  *pmVar1 = 0;
  return;
}

Assistant:

void Dice::resetDiceValuesMap() {
    DiceValues[DiceOptions::Heal] = 0;
    DiceValues[DiceOptions::Attack] = 0;
    DiceValues[DiceOptions::Celebrity] = 0;
    DiceValues[DiceOptions::Destruction] = 0;
    DiceValues[DiceOptions::Energy] = 0;
    DiceValues[DiceOptions::Ouch] = 0;
}